

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool BasePort::ParseOptions
               (char *arg,PortType *portType,int *portNum,string *IPaddr,bool *fwBridge,
               ostream *ostr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  size_t sVar6;
  char *__s;
  char local_40 [4];
  uint uStack_3c;
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: no option provided, using default ",0x30);
    builtin_strncpy(local_40,"fw:0",4);
    uStack_3c = uStack_3c & 0xffffff00;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(ostr,local_40,4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    builtin_strncpy(local_40,"fw:0",4);
    uStack_3c = uStack_3c & 0xffffff00;
    bVar2 = ParseOptions(local_40,portType,portNum,IPaddr,fwBridge,(ostream *)&std::cerr);
    return bVar2;
  }
  iVar3 = strncmp(arg,"fw",2);
  if (iVar3 == 0) {
    *portType = PORT_FIREWIRE;
    sVar4 = strlen(arg);
    if (sVar4 == 2) {
LAB_00111be6:
      *portNum = 0;
      return true;
    }
    if (arg[2] != ':') {
      arg = "ParseOptions: missing \":\" after \"fw\"";
      sVar4 = 0x24;
      goto LAB_00111d18;
    }
    iVar3 = __isoc99_sscanf(arg + 3,"%d",portNum);
    if (iVar3 == 1) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: failed to find a port number after \"fw:\" in ",0x3a);
  }
  else {
    iVar3 = strncmp(arg,"eth",3);
    if (iVar3 == 0) {
      *portType = PORT_ETH_RAW;
      *fwBridge = false;
      iVar3 = strncmp(arg + 3,"fw",2);
      *fwBridge = iVar3 == 0;
      iVar3 = __isoc99_sscanf(arg + (ulong)(iVar3 == 0) * 2 + 4,"%d",portNum);
      return iVar3 == 1;
    }
    iVar3 = strncmp(arg,"udp",3);
    if (iVar3 == 0) {
      *portType = PORT_ETH_UDP;
      *fwBridge = false;
      iVar3 = strncmp(arg + 3,"fw",2);
      *fwBridge = iVar3 == 0;
      lVar1 = (ulong)(iVar3 == 0) * 2;
      sVar4 = lVar1 + 3;
      sVar6 = strlen(arg);
      if (sVar6 == sVar4) {
        std::__cxx11::string::_M_replace((ulong)IPaddr,0,(char *)IPaddr->_M_string_length,0x11dc72);
        return true;
      }
      if (arg[sVar4] == ':') {
        sVar4 = strlen(arg + lVar1 + 4);
        if (7 < sVar4) {
          std::__cxx11::string::assign((char *)IPaddr);
          return true;
        }
        return true;
      }
      if (iVar3 == 0) {
        __s = "ParseOptions: missing \":\" after \"udpfw\"";
        sVar4 = 0x27;
      }
      else {
        __s = "ParseOptions: missing \":\" after \"udp\"";
        sVar4 = 0x25;
      }
      goto LAB_00111e01;
    }
    iVar3 = strncmp(arg,"emio",4);
    if (iVar3 != 0) {
      *portType = PORT_FIREWIRE;
      iVar3 = __isoc99_sscanf(arg,"%d",portNum);
      if (iVar3 == 1) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (ostr,"ParseOptions: failed to find a FireWire port number in ",0x37);
      sVar4 = strlen(arg);
LAB_00111d18:
      std::__ostream_insert<char,std::char_traits<char>>(ostr,arg,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)ostr + -0x18) + (char)ostr);
      std::ostream::put((char)ostr);
      std::ostream::flush();
      return false;
    }
    *portType = PORT_ZYNQ_EMIO;
    sVar4 = strlen(arg);
    if (sVar4 == 4) goto LAB_00111be6;
    if (arg[4] != ':') {
      __s = "ParseOptions: missing \":\" after \"emio\"";
      sVar4 = 0x26;
      goto LAB_00111e01;
    }
    iVar3 = __isoc99_sscanf(arg + 5,"%d",portNum);
    if (iVar3 == 1) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseOptions: failed to find a port number after \"emio:\" in ",0x3c);
  }
  __s = arg + 3;
  sVar4 = strlen(__s);
LAB_00111e01:
  std::__ostream_insert<char,std::char_traits<char>>(ostr,__s,sVar4);
  std::endl<char,std::char_traits<char>>(ostr);
  return false;
}

Assistant:

bool BasePort::ParseOptions(const char *arg, PortType &portType, int &portNum, std::string &IPaddr,
                            bool &fwBridge, std::ostream &ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseOptions: no option provided, using default "
             << DefaultPort() << std::endl;
        return ParseOptions(DefaultPort().c_str(), portType, portNum, IPaddr, fwBridge);
    }
    // expecting proper options
    if (strncmp(arg, "fw", 2) == 0) {
        portType = PORT_FIREWIRE;
        // no port specified
        if (strlen(arg) == 2) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[2] != ':') {
            ostr << "ParseOptions: missing \":\" after \"fw\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+3, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"fw:\" in " << arg+3 << std::endl;
        return false;
    }
    else if (strncmp(arg, "eth", 3) == 0) {
        portType = PORT_ETH_RAW;
        fwBridge = false;
        unsigned int numOffset = 4;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            numOffset += 2;
        }
        return (sscanf(arg+numOffset, "%d", &portNum) == 1);
    }
    else if (strncmp(arg, "udp", 3) == 0) {
        portType = PORT_ETH_UDP;
        fwBridge = false;
        unsigned int colonPos = 3;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            colonPos += 2;
        }
        // no option specified
        if (strlen(arg) == colonPos) {
            IPaddr = ETH_UDP_DEFAULT_IP;
            return true;
        }
        // make sure separator is here
        if (arg[colonPos] != ':') {
            if (colonPos == 3)
                ostr << "ParseOptions: missing \":\" after \"udp\"" << std::endl;
            else
                ostr << "ParseOptions: missing \":\" after \"udpfw\"" << std::endl;
            return false;
        }
        // For now, if at least 8 characters, assume a valid IP address
        if (strlen(arg+colonPos+1) >= 8)
            IPaddr.assign(arg+colonPos+1);
        return true;
    }
    else if (strncmp(arg, "emio", 4) == 0) {
        portType = PORT_ZYNQ_EMIO;
        // no port specified
        if (strlen(arg) == 4) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[4] != ':') {
            ostr << "ParseOptions: missing \":\" after \"emio\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+5, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"emio:\" in " << arg+3 << std::endl;
        return false;
    }
    // older default, fw and looking for port number
    portType = PORT_FIREWIRE;
    // scan port number
    if (sscanf(arg, "%d", &portNum) == 1) {
        return true;
    }
    ostr << "ParseOptions: failed to find a FireWire port number in " << arg << std::endl;
    return false;
}